

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressContinue_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame,
                 U32 lastFrameChunk)

{
  ZSTD_matchState_t *window;
  unsigned_long_long uVar1;
  ushort uVar2;
  U32 UVar3;
  uint uVar4;
  U32 reducerValue;
  U32 UVar6;
  U32 UVar7;
  size_t sVar8;
  size_t sVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ZSTD_CCtx_params *pZVar13;
  short *psVar14;
  undefined8 *puVar15;
  size_t sVar16;
  size_t srcSize_00;
  size_t sStackY_100;
  ZSTD_CCtx_params in_stack_ffffffffffffff08;
  ZSTD_matchState_t *ms;
  int iVar5;
  
  if (cctx->stage == ZSTDcs_created) {
    sStackY_100 = 0xffffffffffffffc4;
  }
  else {
    if (cctx->stage == ZSTDcs_init && frame != 0) {
      uVar1 = cctx->pledgedSrcSizePlusOne;
      UVar3 = cctx->dictID;
      pZVar13 = &cctx->appliedParams;
      puVar15 = (undefined8 *)&stack0xffffffffffffff08;
      for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
        *puVar15 = *(undefined8 *)pZVar13;
        pZVar13 = (ZSTD_CCtx_params *)&(pZVar13->cParams).chainLog;
        puVar15 = puVar15 + 1;
      }
      sVar8 = ZSTD_writeFrameHeader(dst,dstCapacity,in_stack_ffffffffffffff08,uVar1 - 1,UVar3);
      if (0xffffffffffffff88 < sVar8) {
        return sVar8;
      }
      dstCapacity = dstCapacity - sVar8;
      dst = (void *)((long)dst + sVar8);
      cctx->stage = ZSTDcs_ongoing;
    }
    else {
      sVar8 = 0;
    }
    sStackY_100 = sVar8;
    if (srcSize != 0) {
      window = &(cctx->blockState).matchState;
      UVar3 = ZSTD_window_update(&window->window,src,srcSize);
      if (UVar3 == 0) {
        (cctx->blockState).matchState.nextToUpdate = (cctx->blockState).matchState.window.dictLimit;
      }
      if ((cctx->appliedParams).ldmParams.enableLdm != 0) {
        ZSTD_window_update(&(cctx->ldmState).window,src,srcSize);
      }
      if (frame == 0) {
        if (0xe0000000 <
            (uint)(((int)src + (int)srcSize) - *(int *)&(cctx->blockState).matchState.window.base))
        {
          UVar3 = ZSTD_window_correctOverflow
                            (&window->window,
                             ((cctx->appliedParams).cParams.chainLog - 1) +
                             (uint)((cctx->appliedParams).cParams.strategy < ZSTD_btlazy2),
                             1 << ((byte)(cctx->appliedParams).cParams.windowLog & 0x1f),src);
          ZSTD_reduceIndex(cctx,UVar3);
          uVar4 = (cctx->blockState).matchState.nextToUpdate;
          UVar7 = uVar4 - UVar3;
          if (uVar4 < UVar3) {
            UVar7 = 0;
          }
          (cctx->blockState).matchState.nextToUpdate = UVar7;
          (cctx->blockState).matchState.loadedDictEnd = 0;
          (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
        }
        sStackY_100 = ZSTD_compressBlock_internal(cctx,dst,dstCapacity,src,srcSize);
      }
      else {
        UVar3 = 1 << ((byte)(cctx->appliedParams).cParams.windowLog & 0x1f);
        srcSize_00 = cctx->blockSize;
        if ((cctx->appliedParams).fParams.checksumFlag != 0) {
          XXH64_update(&cctx->xxhState,src,srcSize);
        }
        psVar14 = (short *)dst;
        for (sVar16 = srcSize; sVar16 != 0; sVar16 = sVar16 - srcSize_00) {
          uVar2 = (ushort)lastFrameChunk & 1;
          if (srcSize_00 < sVar16) {
            uVar2 = 0;
          }
          if (dstCapacity < 6) {
            return 0xffffffffffffffba;
          }
          if (sVar16 < srcSize_00) {
            srcSize_00 = sVar16;
          }
          iVar5 = (int)(void *)((long)src + srcSize_00);
          uVar4 = iVar5 - *(int *)&(cctx->blockState).matchState.window.base;
          if (uVar4 < 0xe0000001) {
            UVar7 = (cctx->blockState).matchState.loadedDictEnd;
          }
          else {
            reducerValue = ZSTD_window_correctOverflow
                                     (&window->window,
                                      ((cctx->appliedParams).cParams.chainLog - 1) +
                                      (uint)((cctx->appliedParams).cParams.strategy < ZSTD_btlazy2),
                                      UVar3,src);
            ZSTD_reduceIndex(cctx,reducerValue);
            uVar4 = (cctx->blockState).matchState.nextToUpdate;
            UVar7 = 0;
            UVar6 = uVar4 - reducerValue;
            if (uVar4 < reducerValue) {
              UVar6 = 0;
            }
            (cctx->blockState).matchState.nextToUpdate = UVar6;
            (cctx->blockState).matchState.loadedDictEnd = 0;
            (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
            uVar4 = iVar5 - *(int *)&(cctx->blockState).matchState.window.base;
          }
          uVar10 = (cctx->blockState).matchState.window.lowLimit;
          if (UVar7 + UVar3 < uVar4) {
            uVar4 = uVar4 - UVar3;
            if (uVar10 < uVar4) {
              (cctx->blockState).matchState.window.lowLimit = uVar4;
              uVar10 = uVar4;
            }
            if ((cctx->blockState).matchState.window.dictLimit < uVar10) {
              (cctx->blockState).matchState.window.dictLimit = uVar10;
            }
            (cctx->blockState).matchState.loadedDictEnd = 0;
            (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
          }
          if ((cctx->blockState).matchState.nextToUpdate < uVar10) {
            (cctx->blockState).matchState.nextToUpdate = uVar10;
          }
          sVar9 = ZSTD_compressBlock_internal
                            (cctx,(void *)((long)psVar14 + 3),dstCapacity - 3,src,srcSize_00);
          if (0xffffffffffffff88 < sVar9) {
            return sVar9;
          }
          if (sVar9 == 0) {
            uVar12 = srcSize_00 + 3;
            if (dstCapacity < uVar12) {
              return 0xffffffffffffffba;
            }
            *psVar14 = uVar2 + (short)srcSize_00 * 8;
            *(char *)(psVar14 + 1) = (char)(srcSize_00 >> 0xd);
            memcpy((void *)((long)psVar14 + 3),src,srcSize_00);
            if (0xffffffffffffff88 < uVar12) {
              return uVar12;
            }
          }
          else {
            *psVar14 = uVar2 + 4 + (short)sVar9 * 8;
            *(char *)(psVar14 + 1) = (char)(sVar9 >> 0xd);
            uVar12 = sVar9 + 3;
          }
          psVar14 = (short *)((long)psVar14 + uVar12);
          dstCapacity = dstCapacity - uVar12;
          src = (void *)((long)src + srcSize_00);
        }
        if ((lastFrameChunk != 0) && (dst < psVar14)) {
          cctx->stage = ZSTDcs_ending;
        }
        sStackY_100 = (long)psVar14 - (long)dst;
      }
      if (sStackY_100 < 0xffffffffffffff89) {
        uVar1 = cctx->consumedSrcSize;
        cctx->consumedSrcSize = uVar1 + srcSize;
        sStackY_100 = sStackY_100 + sVar8;
        cctx->producedCSize = cctx->producedCSize + sStackY_100;
        sVar8 = 0xffffffffffffffb8;
        if (uVar1 + srcSize + 1 <= cctx->pledgedSrcSizePlusOne) {
          sVar8 = sStackY_100;
        }
        if (cctx->pledgedSrcSizePlusOne != 0) {
          sStackY_100 = sVar8;
        }
      }
    }
  }
  return sStackY_100;
}

Assistant:

static size_t ZSTD_compressContinue_internal (ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                               U32 frame, U32 lastFrameChunk)
{
    ZSTD_matchState_t* const ms = &cctx->blockState.matchState;
    size_t fhSize = 0;

    DEBUGLOG(5, "ZSTD_compressContinue_internal, stage: %u, srcSize: %u",
                cctx->stage, (unsigned)srcSize);
    if (cctx->stage==ZSTDcs_created) return ERROR(stage_wrong);   /* missing init (ZSTD_compressBegin) */

    if (frame && (cctx->stage==ZSTDcs_init)) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, cctx->appliedParams,
                                       cctx->pledgedSrcSizePlusOne-1, cctx->dictID);
        if (ZSTD_isError(fhSize)) return fhSize;
        dstCapacity -= fhSize;
        dst = (char*)dst + fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (!srcSize) return fhSize;  /* do not generate an empty block if no input */

    if (!ZSTD_window_update(&ms->window, src, srcSize)) {
        ms->nextToUpdate = ms->window.dictLimit;
    }
    if (cctx->appliedParams.ldmParams.enableLdm) {
        ZSTD_window_update(&cctx->ldmState.window, src, srcSize);
    }

    if (!frame) {
        /* overflow check and correction for block mode */
        if (ZSTD_window_needOverflowCorrection(ms->window, (const char*)src + srcSize)) {
            U32 const cycleLog = ZSTD_cycleLog(cctx->appliedParams.cParams.chainLog, cctx->appliedParams.cParams.strategy);
            U32 const correction = ZSTD_window_correctOverflow(&ms->window, cycleLog, 1 << cctx->appliedParams.cParams.windowLog, src);
            ZSTD_STATIC_ASSERT(ZSTD_CHAINLOG_MAX <= 30);
            ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX_32 <= 30);
            ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX <= 31);
            ZSTD_reduceIndex(cctx, correction);
            if (ms->nextToUpdate < correction) ms->nextToUpdate = 0;
            else ms->nextToUpdate -= correction;
            ms->loadedDictEnd = 0;
            ms->dictMatchState = NULL;
        }
    }

    DEBUGLOG(5, "ZSTD_compressContinue_internal (blockSize=%u)", (unsigned)cctx->blockSize);
    {   size_t const cSize = frame ?
                             ZSTD_compress_frameChunk (cctx, dst, dstCapacity, src, srcSize, lastFrameChunk) :
                             ZSTD_compressBlock_internal (cctx, dst, dstCapacity, src, srcSize);
        if (ZSTD_isError(cSize)) return cSize;
        cctx->consumedSrcSize += srcSize;
        cctx->producedCSize += (cSize + fhSize);
        assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
        if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
            ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
            if (cctx->consumedSrcSize+1 > cctx->pledgedSrcSizePlusOne) {
                DEBUGLOG(4, "error : pledgedSrcSize = %u, while realSrcSize >= %u",
                    (unsigned)cctx->pledgedSrcSizePlusOne-1, (unsigned)cctx->consumedSrcSize);
                return ERROR(srcSize_wrong);
            }
        }
        return cSize + fhSize;
    }
}